

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O1

void __thiscall
tchecker::details::
statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>::visit
          (statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_local_array_statement_t *stmt)

{
  vector<long,_std::allocator<long>_> *pvVar1;
  iterator iVar2;
  uint uVar3;
  typed_var_expression_t *ptVar4;
  variable_id_t vVar5;
  ulong uVar6;
  ulong local_28;
  
  ptVar4 = typed_local_array_statement_t::variable(stmt);
  vVar5 = ptVar4->_id;
  ptVar4 = typed_local_array_statement_t::variable(stmt);
  uVar3 = (**(code **)(*(long *)&(ptVar4->super_typed_lvalue_expression_t).super_typed_expression_t
                      + 0x38))(ptVar4);
  if (uVar3 != 0) {
    uVar6 = (ulong)uVar3;
    do {
      local_28 = 5;
      pvVar1 = (this->_bytecode_back_inserter).container;
      iVar2._M_current =
           (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
      if (iVar2._M_current ==
          (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (pvVar1,iVar2,(long *)&local_28);
      }
      else {
        *iVar2._M_current = 5;
        (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      local_28 = (ulong)vVar5;
      pvVar1 = (this->_bytecode_back_inserter).container;
      iVar2._M_current =
           (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
      if (iVar2._M_current ==
          (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (pvVar1,iVar2,(long *)&local_28);
      }
      else {
        *iVar2._M_current = local_28;
        (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      local_28 = 5;
      pvVar1 = (this->_bytecode_back_inserter).container;
      iVar2._M_current =
           (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
      if (iVar2._M_current ==
          (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (pvVar1,iVar2,(long *)&local_28);
      }
      else {
        *iVar2._M_current = 5;
        (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      local_28 = 0;
      pvVar1 = (this->_bytecode_back_inserter).container;
      iVar2._M_current =
           (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
      if (iVar2._M_current ==
          (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (pvVar1,iVar2,(long *)&local_28);
      }
      else {
        *iVar2._M_current = 0;
        (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      local_28 = 0x1c;
      pvVar1 = (this->_bytecode_back_inserter).container;
      iVar2._M_current =
           (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
      if (iVar2._M_current ==
          (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (pvVar1,iVar2,(long *)&local_28);
      }
      else {
        *iVar2._M_current = 0x1c;
        (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      vVar5 = vVar5 + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

virtual void visit(tchecker::typed_local_array_statement_t const & stmt)
  {
    tchecker::variable_size_t id = stmt.variable().id();
    tchecker::variable_size_t asize = stmt.variable().size();

    for (tchecker::variable_size_t i = 0; i < asize; i++) {
      _bytecode_back_inserter = VM_PUSH;
      _bytecode_back_inserter = id + i;
      _bytecode_back_inserter = VM_PUSH;
      _bytecode_back_inserter = 0;
      _bytecode_back_inserter = VM_INIT_FRAME;
    }
  }